

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

void ures_getAllItemsWithFallback_63
               (UResourceBundle *bundle,char *path,ResourceSink *sink,UErrorCode *errorCode)

{
  UBool UVar1;
  undefined1 local_110 [8];
  ResourceDataValue value;
  UResourceBundle *rb;
  UResourceBundle stackBundle;
  UErrorCode *errorCode_local;
  ResourceSink *sink_local;
  char *path_local;
  UResourceBundle *bundle_local;
  
  stackBundle._192_8_ = errorCode;
  UVar1 = U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (path == (char *)0x0) {
      *(undefined4 *)stackBundle._192_8_ = 1;
    }
    else {
      ures_initStackObject_63((UResourceBundle *)&rb);
      value._16_8_ = bundle;
      if (*path != '\0') {
        value._16_8_ = ures_getByKeyWithFallback_63
                                 (bundle,path,(UResourceBundle *)&rb,
                                  (UErrorCode *)stackBundle._192_8_);
        UVar1 = U_FAILURE(*(UErrorCode *)stackBundle._192_8_);
        if (UVar1 != '\0') {
          ures_close_63((UResourceBundle *)&rb);
          return;
        }
      }
      icu_63::ResourceDataValue::ResourceDataValue((ResourceDataValue *)local_110);
      anon_unknown.dwarf_287a2e::getAllItemsWithFallback
                ((UResourceBundle *)value._16_8_,(ResourceDataValue *)local_110,sink,
                 (UErrorCode *)stackBundle._192_8_);
      ures_close_63((UResourceBundle *)&rb);
      icu_63::ResourceDataValue::~ResourceDataValue((ResourceDataValue *)local_110);
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
ures_getAllItemsWithFallback(const UResourceBundle *bundle, const char *path,
                             icu::ResourceSink &sink, UErrorCode &errorCode) {
    if (U_FAILURE(errorCode)) { return; }
    if (path == NULL) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    UResourceBundle stackBundle;
    ures_initStackObject(&stackBundle);
    const UResourceBundle *rb;
    if (*path == 0) {
        // empty path
        rb = bundle;
    } else {
        rb = ures_getByKeyWithFallback(bundle, path, &stackBundle, &errorCode);
        if (U_FAILURE(errorCode)) {
            ures_close(&stackBundle);
            return;
        }
    }
    // Get all table items with fallback.
    ResourceDataValue value;
    getAllItemsWithFallback(rb, value, sink, errorCode);
    ures_close(&stackBundle);
}